

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O1

bool __thiscall ON_MD5_Hash::Read(ON_MD5_Hash *this,ON_BinaryArchive *archive)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int major_version;
  int minor_version;
  int local_20 [2];
  
  uVar1 = ZeroDigest.m_digest._8_8_;
  *(undefined8 *)this->m_digest = ZeroDigest.m_digest._0_8_;
  *(undefined8 *)(this->m_digest + 8) = uVar1;
  bVar3 = false;
  local_20[0] = 0;
  local_20[1] = 0;
  bVar2 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_20,local_20 + 1);
  if (bVar2) {
    if (local_20[0] == 1) {
      bVar2 = ON_BinaryArchive::ReadByte(archive,0x10,this);
    }
    else {
      bVar2 = false;
    }
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_MD5_Hash::Read(
  class ON_BinaryArchive& archive
  )
{
  *this = ON_MD5_Hash::ZeroDigest;
  bool rc = false;
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version))
    return rc;
  for (;;)
  {
    if ( 1 != major_version )
      break;
    if (!archive.ReadByte(16,m_digest))
      break;
    rc = true;
    break;
  }
  if (!archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}